

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_entry_list_t.c
# Opt level: O3

MMDB_entry_data_list_s * test_bytes_value(MMDB_entry_data_list_s *entry_data_list)

{
  MMDB_entry_data_list_s *pMVar1;
  int *__dest;
  size_t __size;
  
  pMVar1 = entry_data_list->next;
  cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
                ,0x3b,(pMVar1->entry_data).type,"==",4,"\'bytes\' key\'s value is bytes",0);
  __size = (size_t)(pMVar1->entry_data).data_size;
  __dest = (int *)malloc(__size);
  if (__dest == (int *)0x0) {
    bail_out(0,"malloc failed",0);
    __size = (size_t)(pMVar1->entry_data).data_size;
  }
  memcpy(__dest,(pMVar1->entry_data).field_1.utf8_string,__size);
  ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
            ,0x43,(uint)(*__dest == 0x2a000000),"got expected value for bytes key",0);
  free(__dest);
  return pMVar1;
}

Assistant:

MMDB_entry_data_list_s *
test_bytes_value(MMDB_entry_data_list_s *entry_data_list) {
    MMDB_entry_data_list_s *value = entry_data_list = entry_data_list->next;

    cmp_ok(value->entry_data.type,
           "==",
           MMDB_DATA_TYPE_BYTES,
           "'bytes' key's value is bytes");
    uint8_t *bytes = malloc(value->entry_data.data_size);
    if (NULL == bytes) {
        BAIL_OUT("malloc failed");
    }
    memcpy(bytes, value->entry_data.bytes, value->entry_data.data_size);
    uint8_t expect[] = {0x00, 0x00, 0x00, 0x2a};

    ok(memcmp(bytes, expect, 4) == 0, "got expected value for bytes key");

    free((void *)bytes);

    return entry_data_list;
}